

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec.h
# Opt level: O2

void __thiscall
TPZVec<Fad<Fad<double>_>_>::Resize
          (TPZVec<Fad<Fad<double>_>_> *this,int64_t newsize,Fad<Fad<double>_> *object)

{
  undefined8 *puVar1;
  double dVar2;
  undefined1 auVar3 [16];
  ulong uVar4;
  ulong uVar5;
  int64_t *piVar6;
  ostream *poVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  Fad<Fad<double>_> *pFVar11;
  Fad<Fad<double>_> *pFVar12;
  
  if (newsize < 0) {
    poVar7 = std::operator<<((ostream *)&std::cerr,"TPZVec::Resize. Bad parameter newsize.");
    std::endl<char,std::char_traits<char>>(poVar7);
    std::ostream::flush();
    return;
  }
  lVar9 = this->fNElements;
  if (lVar9 != newsize) {
    if (newsize == 0) {
      pFVar12 = (Fad<Fad<double>_> *)0x0;
    }
    else {
      auVar3._8_8_ = 0;
      auVar3._0_8_ = newsize;
      uVar4 = SUB168(auVar3 * ZEXT816(0x58),0);
      uVar5 = uVar4 + 8;
      if (0xfffffffffffffff7 < uVar4) {
        uVar5 = 0xffffffffffffffff;
      }
      uVar4 = 0xffffffffffffffff;
      if (SUB168(auVar3 * ZEXT816(0x58),8) == 0) {
        uVar4 = uVar5;
      }
      piVar6 = (int64_t *)operator_new__(uVar4);
      *piVar6 = newsize;
      pFVar12 = (Fad<Fad<double>_> *)(piVar6 + 1);
      lVar8 = 0;
      do {
        *(undefined8 *)((long)piVar6 + lVar8 + 0x10) = 0;
        *(undefined4 *)((long)piVar6 + lVar8 + 0x18) = 0;
        puVar1 = (undefined8 *)((long)piVar6 + lVar8 + 0x50);
        *puVar1 = 0;
        puVar1[1] = 0;
        *(undefined4 *)((long)piVar6 + lVar8 + 0x30) = 0;
        puVar1 = (undefined8 *)((long)piVar6 + lVar8 + 0x20);
        *puVar1 = 0;
        puVar1[1] = 0;
        *(undefined4 *)((long)piVar6 + lVar8 + 0x48) = 0;
        puVar1 = (undefined8 *)((long)piVar6 + lVar8 + 0x38);
        *puVar1 = 0;
        puVar1[1] = 0;
        lVar8 = lVar8 + 0x58;
      } while (newsize * 0x58 - lVar8 != 0);
    }
    if (newsize <= lVar9) {
      lVar9 = newsize;
    }
    lVar10 = 0;
    lVar8 = lVar9;
    if (lVar9 < 1) {
      lVar9 = lVar10;
      lVar8 = lVar10;
    }
    while (lVar9 != 0) {
      Fad<Fad<double>_>::operator=
                ((Fad<Fad<double>_> *)((long)&pFVar12->field_0x0 + lVar10),
                 (Fad<Fad<double>_> *)(&this->fStore->field_0x0 + lVar10));
      lVar10 = lVar10 + 0x58;
      lVar9 = lVar9 + -1;
    }
    pFVar11 = pFVar12 + lVar8;
    for (; lVar8 < newsize; lVar8 = lVar8 + 1) {
      Fad<Fad<double>_>::operator=(pFVar11,object);
      pFVar11 = pFVar11 + 1;
    }
    pFVar11 = this->fStore;
    if (pFVar11 != (Fad<Fad<double>_> *)0x0) {
      dVar2 = pFVar11[-1].defaultVal.defaultVal;
      if (dVar2 != 0.0) {
        lVar9 = (long)dVar2 * 0x58;
        do {
          Fad<Fad<double>_>::~Fad((Fad<Fad<double>_> *)(&pFVar11[-1].field_0x0 + lVar9));
          lVar9 = lVar9 + -0x58;
        } while (lVar9 != 0);
      }
      operator_delete__(&pFVar11[-1].defaultVal.defaultVal,(long)dVar2 * 0x58 + 8);
    }
    this->fStore = pFVar12;
    this->fNElements = newsize;
    this->fNAlloc = newsize;
  }
  return;
}

Assistant:

void TPZVec<T>::Resize(const int64_t newsize,const T& object) {
#ifndef PZNODEBUG
	if(newsize<0) {
		PZError << "TPZVec::Resize. Bad parameter newsize." << std::endl;
		PZError.flush();
		return;
	}
#endif
	if(newsize == fNElements) return;
	T* newstore;
	if(newsize) newstore = new T[newsize];
	else newstore = 0;
	int64_t large = (fNElements < newsize) ? fNElements : newsize;
	int64_t i;
	for(i=0L; i<large; i++) {
		newstore[i] = fStore[i];
	}
	for(;i<newsize;i++) {   // then only to case : large=fNElement < newsize
		newstore[i] = object;
	}
    if(fStore) {
        delete[] fStore;
        fStore = nullptr;
    }
	fStore = newstore;
	fNElements = newsize;//cedric 20/11/99 e 29/04/00
    fNAlloc = newsize;
}